

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGI.cpp
# Opt level: O0

bool __thiscall CGI::check_first_line(CGI *this,CharContent *first_line,Response *response)

{
  size_t sVar1;
  size_type sVar2;
  reference pvVar3;
  size_t sVar4;
  CharContent local_b8;
  undefined4 local_90;
  CharContent local_80;
  vector<CharContent,_std::allocator<CharContent>_> local_58;
  undefined1 local_40 [8];
  vector<CharContent,_std::allocator<CharContent>_> string_list;
  Response *response_local;
  CharContent *first_line_local;
  CGI *this_local;
  
  string_list.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = &response->code;
  std::vector<CharContent,_std::allocator<CharContent>_>::vector
            ((vector<CharContent,_std::allocator<CharContent>_> *)local_40);
  CharContent::CharContent(&local_80," ");
  CharContent::split(&local_58,first_line,&local_80);
  std::vector<CharContent,_std::allocator<CharContent>_>::operator=
            ((vector<CharContent,_std::allocator<CharContent>_> *)local_40,&local_58);
  std::vector<CharContent,_std::allocator<CharContent>_>::~vector(&local_58);
  CharContent::~CharContent(&local_80);
  sVar2 = std::vector<CharContent,_std::allocator<CharContent>_>::size
                    ((vector<CharContent,_std::allocator<CharContent>_> *)local_40);
  if (sVar2 < 3) {
    this_local._7_1_ = false;
  }
  else {
    pvVar3 = std::vector<CharContent,_std::allocator<CharContent>_>::operator[]
                       ((vector<CharContent,_std::allocator<CharContent>_> *)local_40,0);
    CharContent::CharContent(&local_b8,"HTTP");
    sVar4 = CharContent::find(pvVar3,&local_b8,0);
    pvVar3 = std::vector<CharContent,_std::allocator<CharContent>_>::operator[]
                       ((vector<CharContent,_std::allocator<CharContent>_> *)local_40,0);
    sVar1 = pvVar3->npos;
    CharContent::~CharContent(&local_b8);
    if (sVar4 == sVar1) {
      this_local._7_1_ = false;
    }
    else {
      pvVar3 = std::vector<CharContent,_std::allocator<CharContent>_>::operator[]
                         ((vector<CharContent,_std::allocator<CharContent>_> *)local_40,0);
      CharContent::operator=
                (string_list.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 1,pvVar3);
      pvVar3 = std::vector<CharContent,_std::allocator<CharContent>_>::operator[]
                         ((vector<CharContent,_std::allocator<CharContent>_> *)local_40,1);
      CharContent::operator=
                (string_list.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,pvVar3);
      this_local._7_1_ = true;
    }
  }
  local_90 = 1;
  std::vector<CharContent,_std::allocator<CharContent>_>::~vector
            ((vector<CharContent,_std::allocator<CharContent>_> *)local_40);
  return this_local._7_1_;
}

Assistant:

bool CGI::check_first_line(CharContent first_line,Response *response){
	std::vector<CharContent> string_list;
	string_list=first_line.split(" ");
	if(string_list.size()<3)
		return false;
	if(string_list[0].find("HTTP")==string_list[0].npos)
		return false;
	response->protocol=string_list[0];
	response->code=string_list[1];
	return true;
}